

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  string token;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  string local_30;
  
  preprocessPattern_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    if ((local_30._M_string_length != 1) && (*local_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::erase(&local_30);
      std::make_shared<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                ((char (*) [2])local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15a078);
      local_48._0_8_ = local_58._0_8_;
      local_48._8_8_ = local_58._8_8_;
      local_58._0_8_ = (element_type *)0x0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      if (this->m_exclusion == true) {
        std::
        make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  ((shared_ptr<Catch::TestSpec::Pattern> *)local_58);
        std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)local_48,
                   (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                   local_58);
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)local_48);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    }
    std::make_shared<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_30);
    local_48._0_8_ = local_58._0_8_;
    local_48._8_8_ = local_58._8_8_;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    if (this->m_exclusion == true) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)local_58);
      std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)local_48,
                 (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                 local_58);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)local_48);
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(".", m_substring);
                if (m_exclusion) {
                    pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
                }
                m_currentFilter.m_patterns.push_back(pattern);
            }

            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(token, m_substring);

            if (m_exclusion) {
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            }
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }